

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

bool __thiscall cmMessenger::GetSuppressDeprecatedWarnings(cmMessenger *this)

{
  cmState *this_00;
  char *val;
  bool local_69;
  allocator local_39;
  string local_38;
  char *local_18;
  char *cacheEntryValue;
  cmMessenger *this_local;
  
  this_00 = this->State;
  cacheEntryValue = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_WARN_DEPRECATED",&local_39);
  val = cmState::GetCacheEntryValue(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_69 = false;
  if (val != (char *)0x0) {
    local_18 = val;
    local_69 = cmSystemTools::IsOff(val);
  }
  return local_69;
}

Assistant:

bool cmMessenger::GetSuppressDeprecatedWarnings() const
{
  const char* cacheEntryValue =
    this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
  return cacheEntryValue && cmSystemTools::IsOff(cacheEntryValue);
}